

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O2

void WebRtcIsac_InitPitchFilter(PitchFiltstr *pitchfiltdata)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0xbe; lVar1 = lVar1 + 1) {
    pitchfiltdata->ubuf[lVar1] = 0.0;
  }
  pitchfiltdata->ystate[0] = 0.0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    pitchfiltdata->ystate[lVar1 + 1] = 0.0;
  }
  pitchfiltdata->oldlagp[0] = 50.0;
  pitchfiltdata->oldgainp[0] = 0.0;
  return;
}

Assistant:

void WebRtcIsac_InitPitchFilter(PitchFiltstr *pitchfiltdata)
{
  int k;

  for (k = 0; k < PITCH_BUFFSIZE; k++) {
    pitchfiltdata->ubuf[k] = 0.0;
  }
  pitchfiltdata->ystate[0] = 0.0;
  for (k = 1; k < (PITCH_DAMPORDER); k++) {
    pitchfiltdata->ystate[k] = 0.0;
  }
  pitchfiltdata->oldlagp[0] = 50.0;
  pitchfiltdata->oldgainp[0] = 0.0;
}